

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void de::anon_unknown_0::singleThreadRemoveTest(WaitMode mode)

{
  undefined1 local_20 [8];
  SpinBarrier barrier;
  WaitMode mode_local;
  
  barrier.m_numLeaving = mode;
  SpinBarrier::SpinBarrier((SpinBarrier *)local_20,3);
  SpinBarrier::removeThread((SpinBarrier *)local_20,barrier.m_numLeaving);
  SpinBarrier::removeThread((SpinBarrier *)local_20,barrier.m_numLeaving);
  SpinBarrier::sync((SpinBarrier *)local_20);
  SpinBarrier::removeThread((SpinBarrier *)local_20,barrier.m_numLeaving);
  SpinBarrier::reset((SpinBarrier *)local_20,1);
  SpinBarrier::sync((SpinBarrier *)local_20);
  SpinBarrier::reset((SpinBarrier *)local_20,2);
  SpinBarrier::removeThread((SpinBarrier *)local_20,barrier.m_numLeaving);
  SpinBarrier::sync((SpinBarrier *)local_20);
  SpinBarrier::~SpinBarrier((SpinBarrier *)local_20);
  return;
}

Assistant:

void singleThreadRemoveTest (SpinBarrier::WaitMode mode)
{
	SpinBarrier barrier(3);

	barrier.removeThread(mode);
	barrier.removeThread(mode);
	barrier.sync(mode);
	barrier.removeThread(mode);

	barrier.reset(1);
	barrier.sync(mode);

	barrier.reset(2);
	barrier.removeThread(mode);
	barrier.sync(mode);
}